

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

size_t __thiscall argparse::Argument::get_arguments_length(Argument *this)

{
  unsigned_long uVar1;
  bool bVar2;
  const_reference this_00;
  size_type sVar3;
  size_type sVar4;
  bool local_81;
  NArgsRange local_70;
  long local_60;
  size_t size;
  char *local_50;
  __sv_type local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  unsigned_long local_20;
  size_t names_size;
  Argument *this_local;
  
  names_size = (size_t)this;
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (&this->m_names);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (&this->m_names);
  local_20 = std::
             accumulate<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,unsigned_long,argparse::Argument::get_arguments_length()const::_lambda(auto:1_const&,auto:2_const&)_1_>
                       (local_28,local_30,0);
  this_00 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front(&this->m_names);
  local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  size = (this->m_prefix_chars)._M_len;
  local_50 = (this->m_prefix_chars)._M_str;
  bVar2 = is_positional(local_48,this->m_prefix_chars);
  uVar1 = local_20;
  if (bVar2) {
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->m_metavar);
    uVar1 = local_20;
    if (bVar2) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_names);
      this_local = (Argument *)(uVar1 + sVar3 + 1);
    }
    else {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&this->m_metavar);
      this_local = (Argument *)(sVar4 + 2);
    }
  }
  else {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_names);
    local_60 = uVar1 + (sVar3 - 1) * 2;
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->m_metavar);
    local_81 = false;
    if (!bVar2) {
      NArgsRange::NArgsRange(&local_70,1,1);
      local_81 = NArgsRange::operator==(&this->m_num_args_range,&local_70);
    }
    if (local_81 != false) {
      sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&this->m_metavar);
      local_60 = sVar4 + 1 + local_60;
    }
    this_local = (Argument *)(local_60 + 2);
  }
  return (size_t)this_local;
}

Assistant:

std::size_t get_arguments_length() const {

    std::size_t names_size = std::accumulate(
        std::begin(m_names), std::end(m_names), std::size_t(0),
        [](const auto &sum, const auto &s) { return sum + s.size(); });

    if (is_positional(m_names.front(), m_prefix_chars)) {
      // A set metavar means this replaces the names
      if (!m_metavar.empty()) {
        // Indent and metavar
        return 2 + m_metavar.size();
      }

      // Indent and space-separated
      return 2 + names_size + (m_names.size() - 1);
    }
    // Is an option - include both names _and_ metavar
    // size = text + (", " between names)
    std::size_t size = names_size + 2 * (m_names.size() - 1);
    if (!m_metavar.empty() && m_num_args_range == NArgsRange{1, 1}) {
      size += m_metavar.size() + 1;
    }
    return size + 2; // indent
  }